

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_net.c
# Opt level: O2

int tnt_net_reply(tnt_stream *s,tnt_reply *r)

{
  int iVar1;
  
  if (s->wrcnt == 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = tnt_reply_from(r,tnt_net_recv_cb,s);
    if ((r->error != (char *)0x0) || ((r->code & 0x80) == 0)) {
      LOCK();
      s->wrcnt = s->wrcnt - 1;
      UNLOCK();
    }
  }
  return iVar1;
}

Assistant:

static int
tnt_net_reply(struct tnt_stream *s, struct tnt_reply *r) {
	if (pm_atomic_load(&s->wrcnt) == 0)
		return 1;
	int rv = tnt_reply_from(r, (tnt_reply_t)tnt_net_recv_cb, s);
	if (r->error || (r->code & TNT_CHUNK) == 0) {
		pm_atomic_fetch_sub(&s->wrcnt, 1);
	}
	return rv;
}